

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O0

ABC_UINT64_T Kit_PlaToTruth6(char *pSop,int nVars)

{
  int iVar1;
  int local_30;
  int local_2c;
  int lit;
  int v;
  ABC_UINT64_T valueOr;
  ABC_UINT64_T valueAnd;
  int nVars_local;
  char *pSop_local;
  
  _lit = Kit_PlaToTruth6::Truth[6];
  local_30 = 0;
  if (6 < nVars) {
    __assert_fail("nVars < 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bool/kit/kitPla.c"
                  ,0x1c8,"ABC_UINT64_T Kit_PlaToTruth6(char *, int)");
  }
  do {
    valueOr = Kit_PlaToTruth6::Truth[7];
    for (local_2c = 0; local_2c < nVars; local_2c = local_2c + 1) {
      if (pSop[local_30] == '1') {
        valueOr = Kit_PlaToTruth6::Truth[local_2c] & valueOr;
      }
      else if (pSop[local_30] == '0') {
        valueOr = (Kit_PlaToTruth6::Truth[local_2c] ^ 0xffffffffffffffff) & valueOr;
      }
      else if (pSop[local_30] != '-') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bool/kit/kitPla.c"
                      ,0x1d2,"ABC_UINT64_T Kit_PlaToTruth6(char *, int)");
      }
      local_30 = local_30 + 1;
    }
    _lit = valueOr | _lit;
    if (pSop[local_30] != ' ') {
      __assert_fail("pSop[lit] == \' \'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bool/kit/kitPla.c"
                    ,0x1d5,"ABC_UINT64_T Kit_PlaToTruth6(char *, int)");
    }
    if (pSop[local_30 + 2] != '\n') {
      __assert_fail("pSop[lit] == \'\\n\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/bool/kit/kitPla.c"
                    ,0x1d8,"ABC_UINT64_T Kit_PlaToTruth6(char *, int)");
    }
    local_30 = local_30 + 3;
  } while (pSop[local_30] != '\0');
  iVar1 = Kit_PlaIsComplement(pSop);
  if (iVar1 != 0) {
    _lit = _lit ^ 0xffffffffffffffff;
  }
  return _lit;
}

Assistant:

ABC_UINT64_T Kit_PlaToTruth6( char * pSop, int nVars )
{
    static ABC_UINT64_T Truth[8] = {
        ABC_CONST(0xAAAAAAAAAAAAAAAA),
        ABC_CONST(0xCCCCCCCCCCCCCCCC),
        ABC_CONST(0xF0F0F0F0F0F0F0F0),
        ABC_CONST(0xFF00FF00FF00FF00),
        ABC_CONST(0xFFFF0000FFFF0000),
        ABC_CONST(0xFFFFFFFF00000000),
        ABC_CONST(0x0000000000000000),
        ABC_CONST(0xFFFFFFFFFFFFFFFF)
    };
    ABC_UINT64_T valueAnd, valueOr = Truth[6];
    int v, lit = 0;
    assert( nVars < 7 );
    do {
        valueAnd = Truth[7];
        for ( v = 0; v < nVars; v++, lit++ )
        {
            if ( pSop[lit] == '1' )
                valueAnd &=  Truth[v];
            else if ( pSop[lit] == '0' )
                valueAnd &= ~Truth[v];
            else if ( pSop[lit] != '-' )
                assert( 0 );
        }
        valueOr |= valueAnd;
        assert( pSop[lit] == ' ' );
        lit++;
        lit++;
        assert( pSop[lit] == '\n' );
        lit++;
    } while ( pSop[lit] );
    if ( Kit_PlaIsComplement(pSop) )
        valueOr = ~valueOr;
    return valueOr;
}